

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::
Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
::~Combine(Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
           *this)

{
  OptionsExtract *in_RDI;
  
  OptionsSingleIn::~OptionsSingleIn((OptionsSingleIn *)0x27ef5f);
  OptionsTranscodeTarget<false>::~OptionsTranscodeTarget((OptionsTranscodeTarget<false> *)in_RDI);
  CommandExtract::OptionsExtract::~OptionsExtract(in_RDI);
  return;
}

Assistant:

void init(cxxopts::Options& opts) {
        (Args::init(opts), ...);
    }